

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

size_t utf8cspn(void *src,void *reject)

{
  bool bVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *src;
  sVar2 = 0;
LAB_0010eca5:
  pcVar4 = (char *)reject;
  if (cVar3 == '\0') {
    return sVar2;
  }
  do {
    bVar1 = false;
    while( true ) {
      if (*pcVar4 == '\0') {
        cVar3 = *(char *)((long)src + 1);
        src = (void *)((long)src + 1);
        sVar2 = sVar2 + 1;
        goto LAB_0010eca5;
      }
      if (bVar1) {
        return sVar2;
      }
      if (*pcVar4 != *src) break;
      bVar1 = true;
      pcVar4 = pcVar4 + 1;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

size_t utf8cspn(const void *src, const void *reject) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *r = (const char *)reject;
    size_t offset = 0;

    while ('\0' != *r) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *r)) && (0 < offset)) {
        return chars;
      } else {
        if (*r == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          r++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            r++;
          } while (0x80 == (0xc0 & *r));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // the current utf8 codepoint in src did not match reject, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
    chars++;
  }

  return chars;
}